

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

_Bool bitset_for_each(bitset_t *b,bitset_iterator iterator,void *ptr)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_RDX;
  code *in_RSI;
  long *in_RDI;
  int r;
  uint64_t t;
  uint64_t w;
  size_t i;
  size_t base;
  ulong local_38;
  ulong local_30;
  long local_28;
  
  local_28 = 0;
  local_30 = 0;
  do {
    if ((ulong)in_RDI[1] <= local_30) {
      return true;
    }
    for (local_38 = *(ulong *)(*in_RDI + local_30 * 8); local_38 != 0;
        local_38 = local_38 & (local_38 ^ 0xffffffffffffffff) + 1 ^ local_38) {
      iVar1 = roaring_trailing_zeroes(local_38);
      uVar2 = (*in_RSI)(iVar1 + local_28,in_RDX);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    local_28 = local_28 + 0x40;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

inline bool bitset_for_each(const bitset_t *b, bitset_iterator iterator,
                            void *ptr) {
    size_t base = 0;
    for (size_t i = 0; i < b->arraysize; ++i) {
        uint64_t w = b->array[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            if (!iterator(r + base, ptr)) return false;
            w ^= t;
        }
        base += 64;
    }
    return true;
}